

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystemBullet.cpp
# Opt level: O1

bool __thiscall
chrono::collision::ChCollisionSystemBullet::RayHit
          (ChCollisionSystemBullet *this,ChVector<double> *from,ChVector<double> *to,
          ChCollisionModel *model,ChRayhitResult *result,short filter_group,short filter_mask)

{
  float fVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined8 in_XMM4_Qa;
  cbtVector3 btto;
  cbtVector3 btfrom;
  AllHitsRayResultCallback rayCallback;
  cbtAlignedObjectArray<const_cbtCollisionObject_*> local_c0;
  undefined8 local_a0;
  ulong uStack_98;
  undefined8 local_90;
  float local_88;
  undefined4 local_84;
  cbtAlignedObjectArray<cbtVector3> local_80;
  cbtAlignedObjectArray<cbtVector3> local_60;
  cbtAlignedObjectArray<float> local_40;
  
  local_88 = (float)to->m_data[2];
  local_c0.m_ownsMemory = true;
  local_c0.m_data = (cbtCollisionObject **)0x0;
  local_c0.m_size = 0;
  local_c0.m_capacity = 0;
  local_a0 = CONCAT44((float)from->m_data[1],(float)from->m_data[0]);
  uStack_98 = (ulong)(uint)(float)from->m_data[2];
  local_90 = CONCAT44((float)to->m_data[1],(float)to->m_data[0]);
  local_84 = 0;
  local_80.m_ownsMemory = true;
  local_80.m_data = (cbtVector3 *)0x0;
  local_80.m_size = 0;
  local_80.m_capacity = 0;
  local_60.m_ownsMemory = true;
  local_60.m_data = (cbtVector3 *)0x0;
  local_60.m_size = 0;
  local_60.m_capacity = 0;
  local_40.m_ownsMemory = true;
  local_40.m_data = (float *)0x0;
  local_40.m_size = 0;
  local_40.m_capacity = 0;
  (*this->bt_collision_world->_vptr_cbtCollisionWorld[8])();
  if ((long)local_c0.m_size < 1) {
    dVar14 = 1.0;
    iVar4 = -1;
  }
  else {
    uVar5 = 0xffffffff;
    fVar7 = 1.0;
    uVar6 = 0;
    do {
      if ((ChCollisionModel *)local_c0.m_data[uVar6]->m_userObjectPointer == model) {
        if (local_40.m_data[uVar6] < fVar7) {
          uVar5 = uVar6 & 0xffffffff;
          fVar7 = local_40.m_data[uVar6];
        }
      }
      iVar4 = (int)uVar5;
      uVar6 = uVar6 + 1;
    } while ((long)local_c0.m_size != uVar6);
    dVar14 = (double)fVar7;
  }
  if (iVar4 == -1) {
    result->hit = false;
  }
  else {
    result->hit = true;
    result->hitModel = (ChCollisionModel *)local_c0.m_data[iVar4]->m_userObjectPointer;
    fVar7 = local_60.m_data[iVar4].m_floats[1];
    fVar1 = local_60.m_data[iVar4].m_floats[2];
    (result->abs_hitPoint).m_data[0] = (double)local_60.m_data[iVar4].m_floats[0];
    (result->abs_hitPoint).m_data[1] = (double)fVar7;
    (result->abs_hitPoint).m_data[2] = (double)fVar1;
    auVar12._0_8_ = (double)local_80.m_data[iVar4].m_floats[0];
    auVar12._8_8_ = in_XMM4_Qa;
    dVar8 = (double)local_80.m_data[iVar4].m_floats[1];
    auVar13._0_8_ = (double)local_80.m_data[iVar4].m_floats[2];
    auVar13._8_8_ = in_XMM4_Qa;
    (result->abs_hitNormal).m_data[0] = auVar12._0_8_;
    (result->abs_hitNormal).m_data[1] = dVar8;
    (result->abs_hitNormal).m_data[2] = auVar13._0_8_;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar8 * dVar8;
    auVar10 = vfmadd231sd_fma(auVar10,auVar12,auVar12);
    auVar10 = vfmadd231sd_fma(auVar10,auVar13,auVar13);
    if (auVar10._0_8_ < 0.0) {
      dVar8 = sqrt(auVar10._0_8_);
    }
    else {
      auVar10 = vsqrtsd_avx(auVar10,auVar10);
      dVar8 = auVar10._0_8_;
    }
    if (dVar8 < 2.2250738585072014e-308) {
      (result->abs_hitNormal).m_data[0] = 1.0;
      (result->abs_hitNormal).m_data[1] = 0.0;
      auVar11 = SUB6416(ZEXT864(0),0) << 0x40;
    }
    else {
      dVar8 = 1.0 / dVar8;
      (result->abs_hitNormal).m_data[0] = dVar8 * (result->abs_hitNormal).m_data[0];
      (result->abs_hitNormal).m_data[1] = dVar8 * (result->abs_hitNormal).m_data[1];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = dVar8 * (result->abs_hitNormal).m_data[2];
    }
    (result->abs_hitNormal).m_data[2] = auVar11._0_8_;
    result->dist_factor = dVar14;
    (*result->hitModel->_vptr_ChCollisionModel[0x25])();
    dVar14 = (result->abs_hitPoint).m_data[2];
    dVar9 = (double)auVar11._0_4_;
    dVar8 = (result->abs_hitNormal).m_data[2];
    dVar2 = (result->abs_hitPoint).m_data[1];
    dVar3 = (result->abs_hitNormal).m_data[1];
    (result->abs_hitPoint).m_data[0] =
         (result->abs_hitPoint).m_data[0] - dVar9 * (result->abs_hitNormal).m_data[0];
    (result->abs_hitPoint).m_data[1] = dVar2 - dVar9 * dVar3;
    (result->abs_hitPoint).m_data[2] = dVar14 - dVar9 * dVar8;
  }
  cbtAlignedObjectArray<float>::~cbtAlignedObjectArray(&local_40);
  cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&local_60);
  cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&local_80);
  cbtAlignedObjectArray<const_cbtCollisionObject_*>::~cbtAlignedObjectArray(&local_c0);
  return iVar4 != -1;
}

Assistant:

bool ChCollisionSystemBullet::RayHit(const ChVector<>& from,
                                     const ChVector<>& to,
                                     ChCollisionModel* model,
                                     ChRayhitResult& result,
                                     short int filter_group,
                                     short int filter_mask) const {
    cbtVector3 btfrom((cbtScalar)from.x(), (cbtScalar)from.y(), (cbtScalar)from.z());
    cbtVector3 btto((cbtScalar)to.x(), (cbtScalar)to.y(), (cbtScalar)to.z());

    cbtCollisionWorld::AllHitsRayResultCallback rayCallback(btfrom, btto);
    rayCallback.m_collisionFilterGroup = filter_group;
    rayCallback.m_collisionFilterMask = filter_mask;

    this->bt_collision_world->rayTest(btfrom, btto, rayCallback);

    // Find the closest hit result on the specified model (if any)
    int hit = -1;
    cbtScalar fraction = 1;
    for (int i = 0; i < rayCallback.m_collisionObjects.size(); ++i) {
        if (rayCallback.m_collisionObjects[i]->getUserPointer() == model && rayCallback.m_hitFractions[i] < fraction) {
            hit = i;
            fraction = rayCallback.m_hitFractions[i];
        }
    }

    // Ray does not hit specified model
    if (hit == -1) {
        result.hit = false;
        return false;
    }

    // Return the closest hit on the specified model
    result.hit = true;
    result.hitModel = static_cast<ChCollisionModel*>(rayCallback.m_collisionObjects[hit]->getUserPointer());
    result.abs_hitPoint.Set(rayCallback.m_hitPointWorld[hit].x(), rayCallback.m_hitPointWorld[hit].y(),
                            rayCallback.m_hitPointWorld[hit].z());
    result.abs_hitNormal.Set(rayCallback.m_hitNormalWorld[hit].x(), rayCallback.m_hitNormalWorld[hit].y(),
                             rayCallback.m_hitNormalWorld[hit].z());
    result.abs_hitNormal.Normalize();
    result.dist_factor = fraction;
    result.abs_hitPoint = result.abs_hitPoint - result.abs_hitNormal * result.hitModel->GetEnvelope();
    return true;
}